

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O3

void __thiscall Clone_model_Test::~Clone_model_Test(Clone_model_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, model)
{
    auto m = libcellml::Model::create();
    m->setId("unique_model");
    m->setName("model");
    m->setEncapsulationId("encapsulation_id");

    auto mClone = m->clone();

    compareModel(m, mClone);
}